

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O1

Msgs * __thiscall curlpp::Multi::info_abi_cxx11_(Msgs *__return_storage_ptr__,Multi *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  mapped_type pEVar3;
  undefined4 *puVar4;
  mapped_type *ppEVar5;
  _List_node_base *p_Var6;
  size_t sVar7;
  int msgsInQueue;
  undefined1 local_34 [4];
  
  (__return_storage_ptr__->
  super__List_base<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  sVar7 = 0;
  while( true ) {
    (__return_storage_ptr__->
    super__List_base<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
    )._M_impl._M_node._M_size = sVar7;
    puVar4 = (undefined4 *)curl_multi_info_read(this->mMultiHandle,local_34);
    if (puVar4 == (undefined4 *)0x0) break;
    uVar1 = *puVar4;
    uVar2 = puVar4[4];
    ppEVar5 = std::
              map<void_*,_const_curlpp::Easy_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_const_curlpp::Easy_*>_>_>
              ::operator[](&this->mHandles,(key_type *)(puVar4 + 2));
    pEVar3 = *ppEVar5;
    p_Var6 = (_List_node_base *)operator_new(0x20);
    p_Var6[1]._M_next = (_List_node_base *)pEVar3;
    p_Var6[1]._M_prev = (_List_node_base *)CONCAT44(uVar1,uVar2);
    std::__detail::_List_node_base::_M_hook(p_Var6);
    sVar7 = (__return_storage_ptr__->
            super__List_base<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
            )._M_impl._M_node._M_size + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

curlpp::Multi::Msgs
curlpp::Multi::info()
{
  CURLMsg * msg; /* for picking up messages with the transfer status */
  
  int msgsInQueue;
  Msgs result;
  while ((msg = curl_multi_info_read(mMultiHandle, &msgsInQueue)) != NULL) {
    Multi::Info inf;
    inf.msg = msg->msg;
    inf.code = msg->data.result;
    result.push_back(std::make_pair(mHandles[msg->easy_handle],inf));
  }

  return result;
}